

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void gl4cts::TextureViewUtilities::getComponentSizeForInternalformat
               (GLenum internalformat,uint *out_rgba_size)

{
  undefined8 uVar1;
  TestError *this;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  out_rgba_size[0] = 0;
  out_rgba_size[1] = 0;
  out_rgba_size[2] = 0;
  out_rgba_size[3] = 0;
  if ((int)internalformat < 0x8814) {
    if (0x8228 < (int)internalformat) {
      switch(internalformat) {
      case 0x8229:
      case 0x8231:
      case 0x8232:
        goto switchD_00a28f2c_caseD_8f94;
      case 0x822a:
      case 0x822d:
      case 0x8233:
      case 0x8234:
switchD_00a28f2c_caseD_8f98:
        *out_rgba_size = 0x10;
        return;
      case 0x822b:
      case 0x8237:
      case 0x8238:
        goto switchD_00a28f2c_caseD_8f95;
      case 0x822c:
      case 0x822f:
      case 0x8239:
      case 0x823a:
        goto switchD_00a28f2c_caseD_8f99;
      case 0x822e:
      case 0x8235:
      case 0x8236:
        *out_rgba_size = 0x20;
        return;
      case 0x8230:
      case 0x823b:
      case 0x823c:
        uVar1 = 0x2000000020;
        goto LAB_00a290df;
      default:
        goto switchD_00a28ec6_caseD_8c3b;
      }
    }
    switch(internalformat) {
    case 0x8051:
      goto switchD_00a28ec6_caseD_8c41;
    case 0x8054:
      goto switchD_00a28fe4_caseD_881b;
    case 0x8056:
      uVar2 = 4;
      uVar3 = 4;
      uVar4 = 4;
      uVar5 = 4;
      break;
    case 0x8057:
      uVar2 = 5;
      uVar3 = 5;
      uVar4 = 5;
      uVar5 = 1;
      break;
    case 0x8058:
      goto switchD_00a28ec6_caseD_8c43;
    case 0x8059:
switchD_00a28f56_caseD_8059:
      uVar2 = 10;
      uVar3 = 10;
      uVar4 = 10;
      uVar5 = 2;
      break;
    case 0x805b:
      goto switchD_00a28fe4_caseD_881a;
    default:
      if (internalformat == 0x81a5) goto switchD_00a28f2c_caseD_8f98;
      if (internalformat == 0x81a6) {
        *out_rgba_size = 0x18;
        return;
      }
    case 0x8052:
    case 0x8053:
    case 0x8055:
    case 0x805a:
switchD_00a28ec6_caseD_8c3b:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unrecognized internalformat",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x24f);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    if ((int)internalformat < 0x8d88) {
      if (0x8cac < (int)internalformat) {
        switch(internalformat) {
        case 0x8d70:
        case 0x8d82:
          goto switchD_00a28fe4_caseD_8814;
        case 0x8d71:
        case 0x8d83:
          goto switchD_00a28fe4_caseD_8815;
        case 0x8d72:
        case 0x8d73:
        case 0x8d74:
        case 0x8d75:
        case 0x8d78:
        case 0x8d79:
        case 0x8d7a:
        case 0x8d7b:
        case 0x8d7e:
        case 0x8d7f:
        case 0x8d80:
        case 0x8d81:
          goto switchD_00a28ec6_caseD_8c3b;
        case 0x8d76:
          goto switchD_00a28fe4_caseD_881a;
        case 0x8d77:
          goto switchD_00a28fe4_caseD_881b;
        case 0x8d7c:
          goto switchD_00a28ec6_caseD_8c43;
        case 0x8d7d:
          goto switchD_00a28ec6_caseD_8c41;
        default:
          if (internalformat != 0x8cad) {
            if (internalformat == 0x8d62) {
              out_rgba_size[0] = 5;
              out_rgba_size[1] = 6;
              out_rgba_size[2] = 5;
              return;
            }
            goto switchD_00a28ec6_caseD_8c3b;
          }
          uVar1 = 0x800000020;
          goto LAB_00a290df;
        }
      }
      switch(internalformat) {
      case 0x8814:
switchD_00a28fe4_caseD_8814:
        uVar2 = 0x20;
        uVar3 = 0x20;
        uVar4 = 0x20;
        uVar5 = 0x20;
        goto LAB_00a290d0;
      case 0x8815:
switchD_00a28fe4_caseD_8815:
        out_rgba_size[0] = 0x20;
        out_rgba_size[1] = 0x20;
        out_rgba_size[2] = 0x20;
        return;
      case 0x8816:
      case 0x8817:
      case 0x8818:
      case 0x8819:
        goto switchD_00a28ec6_caseD_8c3b;
      case 0x881a:
        goto switchD_00a28fe4_caseD_881a;
      case 0x881b:
        goto switchD_00a28fe4_caseD_881b;
      default:
        switch(internalformat) {
        case 0x8c3a:
          out_rgba_size[0] = 0xb;
          out_rgba_size[1] = 0xb;
          out_rgba_size[2] = 10;
          return;
        case 0x8c3b:
        case 0x8c3c:
        case 0x8c3e:
        case 0x8c3f:
        case 0x8c40:
        case 0x8c42:
          break;
        case 0x8c3d:
          uVar2 = 9;
          uVar3 = 9;
          uVar4 = 9;
          uVar5 = 5;
          goto LAB_00a290d0;
        case 0x8c41:
          goto switchD_00a28ec6_caseD_8c41;
        case 0x8c43:
          goto switchD_00a28ec6_caseD_8c43;
        default:
          if (internalformat == 0x88f0) {
            uVar1 = 0x800000018;
            goto LAB_00a290df;
          }
        }
        goto switchD_00a28ec6_caseD_8c3b;
      }
    }
    switch(internalformat) {
    case 0x8f94:
switchD_00a28f2c_caseD_8f94:
      *out_rgba_size = 8;
      return;
    case 0x8f95:
      goto switchD_00a28f2c_caseD_8f95;
    case 0x8f96:
switchD_00a28ec6_caseD_8c41:
      out_rgba_size[0] = 8;
      out_rgba_size[1] = 8;
      out_rgba_size[2] = 8;
      return;
    case 0x8f97:
switchD_00a28ec6_caseD_8c43:
      uVar2 = 8;
      uVar3 = 8;
      uVar4 = 8;
      uVar5 = 8;
      break;
    case 0x8f98:
      goto switchD_00a28f2c_caseD_8f98;
    case 0x8f99:
switchD_00a28f2c_caseD_8f99:
      uVar1 = 0x1000000010;
      goto LAB_00a290df;
    case 0x8f9a:
switchD_00a28fe4_caseD_881b:
      out_rgba_size[0] = 0x10;
      out_rgba_size[1] = 0x10;
      out_rgba_size[2] = 0x10;
      return;
    case 0x8f9b:
switchD_00a28fe4_caseD_881a:
      uVar2 = 0x10;
      uVar3 = 0x10;
      uVar4 = 0x10;
      uVar5 = 0x10;
      break;
    default:
      switch(internalformat) {
      case 0x8d88:
        goto switchD_00a28fe4_caseD_881a;
      case 0x8d89:
        goto switchD_00a28fe4_caseD_881b;
      case 0x8d8a:
      case 0x8d8b:
      case 0x8d8c:
      case 0x8d8d:
        goto switchD_00a28ec6_caseD_8c3b;
      case 0x8d8e:
        goto switchD_00a28ec6_caseD_8c43;
      case 0x8d8f:
        goto switchD_00a28ec6_caseD_8c41;
      default:
        if (internalformat != 0x906f) goto switchD_00a28ec6_caseD_8c3b;
        goto switchD_00a28f56_caseD_8059;
      }
    }
  }
LAB_00a290d0:
  *out_rgba_size = uVar2;
  out_rgba_size[1] = uVar3;
  out_rgba_size[2] = uVar4;
  out_rgba_size[3] = uVar5;
  return;
switchD_00a28f2c_caseD_8f95:
  uVar1 = 0x800000008;
LAB_00a290df:
  *(undefined8 *)out_rgba_size = uVar1;
  return;
}

Assistant:

void TextureViewUtilities::getComponentSizeForInternalformat(const glw::GLenum internalformat,
															 unsigned int*	 out_rgba_size)
{
	/* Note: Compressed textures are not supported by this function */

	/* Reset all the values before we continue. */
	memset(out_rgba_size, 0, 4 /* rgba */ * sizeof(unsigned int));

	/* Depending on the user-specified internalformat, update relevant arguments */
	switch (internalformat)
	{
	case GL_RGBA32F:
	case GL_RGBA32I:
	case GL_RGBA32UI:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 32;
		out_rgba_size[2] = 32;
		out_rgba_size[3] = 32;

		break;
	}

	case GL_RGBA16F:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA16:
	case GL_RGBA16_SNORM:
	{
		out_rgba_size[0] = 16;
		out_rgba_size[1] = 16;
		out_rgba_size[2] = 16;
		out_rgba_size[3] = 16;

		break;
	}

	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_SRGB8_ALPHA8:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 8;
		out_rgba_size[2] = 8;
		out_rgba_size[3] = 8;

		break;
	}

	case GL_RGB10_A2:
	case GL_RGB10_A2UI:
	{
		out_rgba_size[0] = 10;
		out_rgba_size[1] = 10;
		out_rgba_size[2] = 10;
		out_rgba_size[3] = 2;

		break;
	}

	case GL_RGB5_A1:
	{
		out_rgba_size[0] = 5;
		out_rgba_size[1] = 5;
		out_rgba_size[2] = 5;
		out_rgba_size[3] = 1;

		break;
	}

	case GL_RGBA4:
	{
		out_rgba_size[0] = 4;
		out_rgba_size[1] = 4;
		out_rgba_size[2] = 4;
		out_rgba_size[3] = 4;

		break;
	}

	case GL_RGB9_E5:
	{
		out_rgba_size[0] = 9;
		out_rgba_size[1] = 9;
		out_rgba_size[2] = 9;
		out_rgba_size[3] = 5;

		break;
	}

	case GL_R11F_G11F_B10F:
	{
		out_rgba_size[0] = 11;
		out_rgba_size[1] = 11;
		out_rgba_size[2] = 10;

		break;
	}

	case GL_RGB565:
	{
		out_rgba_size[0] = 5;
		out_rgba_size[1] = 6;
		out_rgba_size[2] = 5;

		break;
	}

	case GL_RGB32F:
	case GL_RGB32I:
	case GL_RGB32UI:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 32;
		out_rgba_size[2] = 32;

		break;
	}

	case GL_RGB16_SNORM:
	case GL_RGB16F:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB16:
	{
		out_rgba_size[0] = 16;
		out_rgba_size[1] = 16;
		out_rgba_size[2] = 16;

		break;
	}

	case GL_RGB8_SNORM:
	case GL_RGB8:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_SRGB8:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 8;
		out_rgba_size[2] = 8;

		break;
	}

	case GL_RG32F:
	case GL_RG32I:
	case GL_RG32UI:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 32;

		break;
	}

	case GL_RG16:
	case GL_RG16F:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG16_SNORM:
	{
		out_rgba_size[0] = 16;
		out_rgba_size[1] = 16;

		break;
	}

	case GL_RG8:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG8_SNORM:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 8;

		break;
	}

	case GL_R32F:
	case GL_R32I:
	case GL_R32UI:
	{
		out_rgba_size[0] = 32;

		break;
	}

	case GL_R16F:
	case GL_R16I:
	case GL_R16UI:
	case GL_R16:
	case GL_R16_SNORM:
	case GL_DEPTH_COMPONENT16:
	{
		out_rgba_size[0] = 16;

		break;
	}

	case GL_R8:
	case GL_R8I:
	case GL_R8UI:
	case GL_R8_SNORM:
	{
		out_rgba_size[0] = 8;

		break;
	}

	case GL_DEPTH_COMPONENT24:
	{
		out_rgba_size[0] = 24;

		break;
	}

	case GL_DEPTH32F_STENCIL8:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 8;

		break;
	}

	case GL_DEPTH24_STENCIL8:
	{
		out_rgba_size[0] = 24;
		out_rgba_size[1] = 8;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (interalformat) */
}